

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ReadChunk(Discreet3DSImporter *this,Chunk *pcOut)

{
  uint uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  DeadlyImportError *this_00;
  Logger *this_01;
  allocator<char> local_39;
  string local_38;
  Chunk *local_18;
  Chunk *pcOut_local;
  Discreet3DSImporter *this_local;
  
  local_18 = pcOut;
  pcOut_local = (Chunk *)this;
  if (pcOut == (Chunk *)0x0) {
    __assert_fail("pcOut != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/3DS/3DSLoader.cpp"
                  ,0xfa,"void Assimp::Discreet3DSImporter::ReadChunk(Discreet3DS::Chunk *)");
  }
  uVar2 = StreamReader<false,_false>::GetI2(this->stream);
  local_18->Flag = uVar2;
  uVar3 = StreamReader<false,_false>::GetI4(this->stream);
  local_18->Size = uVar3;
  uVar1 = local_18->Size;
  uVar4 = StreamReader<false,_false>::GetRemainingSize(this->stream);
  if ((ulong)uVar4 < (ulong)uVar1 - 6) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Chunk is too large",&local_39);
    DeadlyImportError::DeadlyImportError(this_00,&local_38);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  uVar1 = local_18->Size;
  uVar4 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
  if ((ulong)uVar4 < (ulong)uVar1 - 6) {
    this_01 = DefaultLogger::get();
    Logger::error(this_01,"3DS: Chunk overflow");
  }
  return;
}

Assistant:

void Discreet3DSImporter::ReadChunk(Discreet3DS::Chunk* pcOut)
{
    ai_assert(pcOut != nullptr);

    pcOut->Flag = stream->GetI2();
    pcOut->Size = stream->GetI4();

    if (pcOut->Size - sizeof(Discreet3DS::Chunk) > stream->GetRemainingSize()) {
        throw DeadlyImportError("Chunk is too large");
    }

    if (pcOut->Size - sizeof(Discreet3DS::Chunk) > stream->GetRemainingSizeToLimit()) {
        ASSIMP_LOG_ERROR("3DS: Chunk overflow");
    }
}